

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Feature.cpp
# Opt level: O1

void __thiscall jbcoin::detail::FeatureCollections::FeatureCollections(FeatureCollections *this)

{
  pointer *ppbVar1;
  char *__s;
  iterator __position;
  pair<jbcoin::base_uint<256UL,_void>,_unsigned_long> *new_start;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>
  *new_start_00;
  size_t len;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  int i;
  long lVar4;
  mapped_type mVar5;
  uint256 f;
  sha512_half_hasher h;
  allocator local_159;
  vector<boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>,boost::container::new_allocator<boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>>,void>
  *local_158;
  vector<boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>,boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>>,void>
  *local_150;
  key_type local_148;
  result_type local_128;
  SHA512_CTX local_108;
  
  local_158 = (vector<boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>,boost::container::new_allocator<boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>>,void>
               *)&this->featureToIndex;
  local_150 = (vector<boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>,boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>>,void>
               *)&this->nameToFeature;
  (this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  (this->features).
  super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (this->features).
  super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->features).
  super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  std::vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>::
  reserve(&this->features,0x17);
  if ((this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_capacity < 0x17) {
    new_start = (pair<jbcoin::base_uint<256UL,_void>,_unsigned_long> *)operator_new(0x398);
    boost::container::
    vector<boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>,boost::container::new_allocator<boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>>,void>
    ::
    priv_forward_range_insert_new_allocation<boost::container::dtl::insert_range_proxy<boost::container::new_allocator<boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>>,boost::move_iterator<boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>*>,boost::container::dtl::pair<jbcoin::base_uint<256ul,void>,unsigned_long>*>>
              (local_158,new_start,0x17,
               (this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_start +
               (this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_size,0,
               (insert_range_proxy<boost::container::new_allocator<boost::container::dtl::pair<jbcoin::base_uint<256UL,_void>,_unsigned_long>_>,_boost::move_iterator<boost::container::dtl::pair<jbcoin::base_uint<256UL,_void>,_unsigned_long>_*>,_boost::container::dtl::pair<jbcoin::base_uint<256UL,_void>,_unsigned_long>_*>
                )0x0);
  }
  if ((this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_capacity < 0x17) {
    new_start_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>
                    *)operator_new(0x5c0);
    boost::container::
    vector<boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>,boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>>,void>
    ::
    priv_forward_range_insert_new_allocation<boost::container::dtl::insert_range_proxy<boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>>,boost::move_iterator<boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>*>,boost::container::dtl::pair<std::__cxx11::string,jbcoin::base_uint<256ul,void>>*>>
              (local_150,new_start_00,0x17,
               (this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_start +
               (this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_size,0,
               (insert_range_proxy<boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>_>,_boost::move_iterator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>_*>,_boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>_*>
                )0x0);
  }
  mVar5 = 0;
  do {
    __s = (&featureNames)[mVar5];
    SHA512_Init(&local_108);
    len = strlen(__s);
    SHA512_Update(&local_108,__s,len);
    basic_sha512_half_hasher::operator_cast_to_base_uint
              (&local_128,(basic_sha512_half_hasher *)&local_108);
    __position._M_current =
         (this->features).
         super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->features).
        super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<jbcoin::base_uint<256ul,void>,std::allocator<jbcoin::base_uint<256ul,void>>>::
      _M_realloc_insert<jbcoin::base_uint<256ul,void>const&>
                ((vector<jbcoin::base_uint<256ul,void>,std::allocator<jbcoin::base_uint<256ul,void>>>
                  *)this,__position,&local_128);
    }
    else {
      *(undefined8 *)((__position._M_current)->pn + 4) = local_128.pn._16_8_;
      *(undefined8 *)((__position._M_current)->pn + 6) = local_128.pn._24_8_;
      *(undefined8 *)(__position._M_current)->pn = local_128.pn._0_8_;
      *(undefined8 *)((__position._M_current)->pn + 2) = local_128.pn._8_8_;
      ppbVar1 = &(this->features).
                 super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
    }
    pmVar2 = boost::container::
             flat_map<jbcoin::base_uint<256UL,_void>,_unsigned_long,_std::less<jbcoin::base_uint<256UL,_void>_>,_void>
             ::priv_subscript((flat_map<jbcoin::base_uint<256UL,_void>,_unsigned_long,_std::less<jbcoin::base_uint<256UL,_void>_>,_void>
                               *)local_158,&local_128);
    *pmVar2 = mVar5;
    std::__cxx11::string::string((string *)&local_148,__s,&local_159);
    pmVar3 = boost::container::
             flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
             ::priv_subscript((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                               *)local_150,&local_148);
    lVar4 = 0;
    do {
      pmVar3->pn[lVar4] = local_128.pn[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    mVar5 = mVar5 + 1;
  } while (mVar5 != 0x17);
  return;
}

Assistant:

detail::FeatureCollections::FeatureCollections()
{
    features.reserve(numFeatures());
    featureToIndex.reserve(numFeatures());
    nameToFeature.reserve(numFeatures());

    for (std::size_t i = 0; i < numFeatures(); ++i)
    {
        auto const name = featureNames[i];
        sha512_half_hasher h;
        h (name, std::strlen (name));
        auto const f = static_cast<uint256>(h);

        features.push_back(f);
        featureToIndex[f] = i;
        nameToFeature[name] = f;
    }
}